

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_crop.cpp
# Opt level: O0

int test_crop(Mat *a,int woffset,int hoffset,int coffset,int outw,int outh,int outc,int woffset2,
             int hoffset2,int coffset2)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int ret;
  Option opt;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> weights;
  ParamDict pd;
  undefined4 in_stack_fffffffffffff5f0;
  undefined4 in_stack_fffffffffffff5f4;
  int in_stack_fffffffffffff600;
  undefined4 in_stack_fffffffffffff604;
  undefined4 in_stack_fffffffffffff608;
  undefined4 in_stack_fffffffffffff60c;
  undefined4 in_stack_fffffffffffff610;
  undefined4 in_stack_fffffffffffff614;
  ParamDict *in_stack_fffffffffffff630;
  _func_void_Crop_ptr *in_stack_fffffffffffff868;
  float in_stack_fffffffffffff874;
  Mat *in_stack_fffffffffffff878;
  Option *in_stack_fffffffffffff880;
  Allocator *in_stack_fffffffffffff888;
  ParamDict *in_stack_fffffffffffff890;
  char *in_stack_fffffffffffff898;
  
  ncnn::ParamDict::ParamDict(in_stack_fffffffffffff630);
  ncnn::ParamDict::set((ParamDict *)&stack0xfffffffffffff6b0,0,in_ESI);
  ncnn::ParamDict::set((ParamDict *)&stack0xfffffffffffff6b0,1,in_EDX);
  ncnn::ParamDict::set((ParamDict *)&stack0xfffffffffffff6b0,2,in_ECX);
  ncnn::ParamDict::set((ParamDict *)&stack0xfffffffffffff6b0,3,in_R8D);
  ncnn::ParamDict::set((ParamDict *)&stack0xfffffffffffff6b0,4,in_R9D);
  ncnn::ParamDict::set((ParamDict *)&stack0xfffffffffffff6b0,5,in_stack_00000008);
  ncnn::ParamDict::set((ParamDict *)&stack0xfffffffffffff6b0,6,in_stack_00000010);
  ncnn::ParamDict::set((ParamDict *)&stack0xfffffffffffff6b0,7,in_stack_00000018);
  ncnn::ParamDict::set((ParamDict *)&stack0xfffffffffffff6b0,8,in_stack_00000020);
  std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x118c0b);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
             CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
             CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608),
             (allocator_type *)CONCAT44(in_stack_fffffffffffff604,in_stack_fffffffffffff600));
  std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x118c30);
  ncnn::Option::Option((Option *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
  iVar1 = test_layer<ncnn::Crop>
                    (in_stack_fffffffffffff898,in_stack_fffffffffffff890,
                     (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_fffffffffffff888,
                     in_stack_fffffffffffff880,in_stack_fffffffffffff878,in_stack_fffffffffffff874,
                     in_stack_fffffffffffff868);
  if (iVar1 != 0) {
    fprintf(_stderr,
            "test_crop failed a.dims=%d a=(%d %d %d) woffset=%d hoffset=%d coffset=%d outw=%d outh=%d outc=%d woffset2=%d hoffset2=%d coffset2=%d\n"
            ,(ulong)*(uint *)(in_RDI + 0x28),(ulong)*(uint *)(in_RDI + 0x2c),
            (ulong)*(uint *)(in_RDI + 0x30),(ulong)*(uint *)(in_RDI + 0x34),in_ESI,in_EDX,in_ECX,
            in_R8D,in_R9D,in_stack_00000008,in_stack_00000010,in_stack_00000018,in_stack_00000020);
    in_stack_fffffffffffff600 = in_R8D;
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
             CONCAT44(in_stack_fffffffffffff604,in_stack_fffffffffffff600));
  ncnn::ParamDict::~ParamDict
            ((ParamDict *)CONCAT44(in_stack_fffffffffffff604,in_stack_fffffffffffff600));
  return iVar1;
}

Assistant:

static int test_crop(const ncnn::Mat& a, int woffset, int hoffset, int coffset, int outw, int outh, int outc, int woffset2, int hoffset2, int coffset2)
{
    ncnn::ParamDict pd;
    pd.set(0, woffset);// woffset
    pd.set(1, hoffset);// hoffset
    pd.set(2, coffset);// coffset
    pd.set(3, outw);// outw
    pd.set(4, outh);// outh
    pd.set(5, outc);// outc
    pd.set(6, woffset2);// woffset2
    pd.set(7, hoffset2);// hoffset2
    pd.set(8, coffset2);// coffset2

    std::vector<ncnn::Mat> weights(0);

    ncnn::Option opt;
    opt.num_threads = 1;
    opt.use_vulkan_compute = true;
    opt.use_int8_inference = false;

    int ret = test_layer<ncnn::Crop>("Crop", pd, weights, opt, a);
    if (ret != 0)
    {
        fprintf(stderr, "test_crop failed a.dims=%d a=(%d %d %d) woffset=%d hoffset=%d coffset=%d outw=%d outh=%d outc=%d woffset2=%d hoffset2=%d coffset2=%d\n", a.dims, a.w, a.h, a.c, woffset, hoffset, coffset, outw, outh, outc, woffset2, hoffset2, coffset2);
    }

    return ret;
}